

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O1

void __thiscall QtPrivate::ExceptionStore::rethrowException(ExceptionStore *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  void *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (this->exceptionHolder)._M_exception_object;
  if (local_18 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    uVar1 = std::rethrow_exception((exception_ptr)&local_18);
    if (local_18 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      _Unwind_Resume(uVar1);
    }
  }
  __stack_chk_fail();
}

Assistant:

void ExceptionStore::rethrowException() const
{
    Q_ASSERT(hasException());
    std::rethrow_exception(exceptionHolder);
}